

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall
dg::pta::PointerIdPointsToSet::addWithUnknownOffset(PointerIdPointsToSet *this,PSNode *node)

{
  bool bVar1;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *this_00;
  PSNode *in_RSI;
  size_t ptrid;
  PSNode *in_stack_00000048;
  PointerIdPointsToSet *in_stack_00000050;
  Offset local_38;
  PSNode *in_stack_ffffffffffffffd0;
  Offset in_stack_ffffffffffffffd8;
  bool local_1;
  
  Offset::Offset(&local_38,Offset::UNKNOWN);
  Pointer::Pointer((Pointer *)&stack0xffffffffffffffd0,in_RSI,local_38);
  this_00 = (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
             *)getPointerID((Pointer *)0x15fe22);
  bVar1 = ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 *)in_stack_ffffffffffffffd8.offset,(unsigned_long)in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    removeAny(in_stack_00000050,in_stack_00000048);
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::set(this_00,in_stack_ffffffffffffffd8.offset);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return local_1;
}

Assistant:

bool addWithUnknownOffset(PSNode *node) {
        auto ptrid = getPointerID({node, Offset::UNKNOWN});
        if (!pointers.get(ptrid)) {
            removeAny(node);
            return !pointers.set(ptrid);
        }
        return false; // we already had it
    }